

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_low_entropy_ref(aec_stream_conflict *strm)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  uint32_t *puVar4;
  int iVar5;
  code *pcVar6;
  internal_state_conflict *state;
  size_t sVar7;
  ulong uVar8;
  
  piVar2 = strm->state;
  if (piVar2->ref != 0) {
    uVar1 = strm->bits_per_sample;
    iVar5 = piVar2->bitp;
    if (iVar5 < (int)uVar1) {
      sVar7 = strm->avail_in;
      do {
        sVar7 = sVar7 - 1;
        if (sVar7 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar7;
        uVar8 = piVar2->acc << 8;
        piVar2->acc = uVar8;
        pbVar3 = strm->next_in;
        strm->next_in = pbVar3 + 1;
        piVar2->acc = *pbVar3 | uVar8;
        iVar5 = iVar5 + 8;
        piVar2->bitp = iVar5;
      } while (iVar5 < (int)uVar1);
    }
    uVar8 = strm->avail_out;
    if (uVar8 < piVar2->bytes_per_sample) {
      return 0;
    }
    puVar4 = piVar2->rsip;
    piVar2->rsip = puVar4 + 1;
    *puVar4 = (uint)(piVar2->acc >> ((char)iVar5 - (char)uVar1 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar1 & 0x3fU));
    strm->avail_out = uVar8 - piVar2->bytes_per_sample;
    piVar2->bitp = piVar2->bitp - strm->bits_per_sample;
  }
  pcVar6 = m_zero_block;
  if (piVar2->id == 1) {
    pcVar6 = m_se;
  }
  piVar2->mode = pcVar6;
  return 1;
}

Assistant:

static int m_low_entropy_ref(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->ref && copysample(strm) == 0)
        return M_EXIT;

    if (state->id == 1)
        state->mode = m_se;
    else
        state->mode = m_zero_block;
    return M_CONTINUE;
}